

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_radix_sort.h
# Opt level: O2

uint * crnlib::indirect_radix_sort<unsigned_int,unsigned_short>
                 (uint num_indices,uint *pIndices0,uint *pIndices1,unsigned_short *pKeys,
                 uint key_ofs,uint key_size,bool init_indices)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint offsets [256];
  uint hist [1024];
  uint auStack_1438 [512];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar4 = (ulong)key_ofs;
  if (init_indices) {
    uVar6 = 0;
    puVar9 = pIndices0;
    for (lVar8 = (ulong)(num_indices & 0xfffffffe) << 2; lVar8 != 0; lVar8 = lVar8 + -8) {
      *puVar9 = uVar6;
      puVar9[1] = uVar6 + 1;
      puVar9 = puVar9 + 2;
      uVar6 = uVar6 + 2;
    }
    if ((num_indices & 1) != 0) {
      pIndices0[num_indices & 0xfffffffe] = uVar6;
    }
  }
  memset(auStack_1438 + 0x100,0,(ulong)key_size << 10);
  switch(key_size) {
  case 1:
    puVar9 = pIndices0;
    for (lVar8 = (ulong)(num_indices & 0xfffffffe) << 2; lVar8 != 0; lVar8 = lVar8 + -8) {
      bVar5 = *(byte *)((long)pKeys + (ulong)puVar9[1] * 2 + uVar4);
      auStack_1438[(ulong)*(byte *)((long)pKeys + (ulong)*puVar9 * 2 + uVar4) + 0x100] =
           auStack_1438[(ulong)*(byte *)((long)pKeys + (ulong)*puVar9 * 2 + uVar4) + 0x100] + 1;
      auStack_1438[(ulong)bVar5 + 0x100] = auStack_1438[(ulong)bVar5 + 0x100] + 1;
      puVar9 = puVar9 + 2;
    }
    if ((num_indices & 1) == 0) goto LAB_0017a596;
    uVar6 = (uint)*(byte *)((long)pKeys + uVar4 + (ulong)pIndices0[num_indices & 0xfffffffe] * 2);
    break;
  case 2:
    puVar9 = pIndices0;
    for (lVar8 = (ulong)(num_indices & 0xfffffffe) << 2; lVar8 != 0; lVar8 = lVar8 + -8) {
      uVar6 = *(uint *)((long)pKeys + (ulong)*puVar9 * 2 + uVar4);
      uVar2 = *(uint *)((long)pKeys + (ulong)puVar9[1] * 2 + uVar4);
      auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] = auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar6 >> 6 & 0x3fc));
      *piVar1 = *piVar1 + 1;
      auStack_1438[(ulong)(uVar2 & 0xff) + 0x100] = auStack_1438[(ulong)(uVar2 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar2 >> 6 & 0x3fc));
      *piVar1 = *piVar1 + 1;
      puVar9 = puVar9 + 2;
    }
    if ((num_indices & 1) == 0) goto LAB_0017a596;
    uVar6 = *(uint *)((long)pKeys + uVar4 + (ulong)pIndices0[num_indices & 0xfffffffe] * 2);
    auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] = auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] + 1;
    uVar6 = uVar6 >> 8 & 0xff | 0x100;
    break;
  case 3:
    for (lVar8 = 0; (ulong)num_indices << 2 != lVar8; lVar8 = lVar8 + 4) {
      uVar6 = *(uint *)((long)pKeys + (ulong)*(uint *)((long)pIndices0 + lVar8) * 2 + uVar4);
      auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] = auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar6 >> 6 & 0x3fc));
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)aiStack_838 + (ulong)(uVar6 >> 0xe & 0x3fc));
      *piVar1 = *piVar1 + 1;
    }
    goto LAB_0017a596;
  case 4:
    for (lVar8 = 0; (ulong)num_indices << 2 != lVar8; lVar8 = lVar8 + 4) {
      uVar6 = *(uint *)((long)pKeys + (ulong)*(uint *)((long)pIndices0 + lVar8) * 2 + uVar4);
      auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] = auStack_1438[(ulong)(uVar6 & 0xff) + 0x100] + 1;
      piVar1 = (int *)((long)aiStack_c38 + (ulong)(uVar6 >> 6 & 0x3fc));
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)aiStack_838 + (ulong)(uVar6 >> 0xe & 0x3fc));
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)((long)aiStack_438 + (ulong)(uVar6 >> 0x16 & 0xfffffffc));
      *piVar1 = *piVar1 + 1;
    }
    goto LAB_0017a596;
  default:
    return (uint *)0x0;
  }
  auStack_1438[(ulong)uVar6 + 0x100] = auStack_1438[(ulong)uVar6 + 0x100] + 1;
LAB_0017a596:
  for (uVar10 = 0; puVar9 = pIndices0, uVar10 != key_size; uVar10 = uVar10 + 1) {
    uVar7 = (ulong)((uint)uVar10 & 0xffffff);
    uVar6 = 0;
    for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 2) {
      auStack_1438[uVar11] = uVar6;
      uVar2 = auStack_1438[uVar7 * 0x100 + uVar11 + 0x100];
      auStack_1438[uVar11 + 1] = uVar6 + uVar2;
      uVar6 = uVar6 + uVar2 + aiStack_c38[uVar7 * 0x100 + (uVar11 - 0xff)];
    }
    bVar5 = (char)uVar10 * '\b';
    for (lVar8 = 0; (ulong)(num_indices & 0xfffffffe) << 2 != lVar8; lVar8 = lVar8 + 8) {
      uVar6 = *(uint *)((long)puVar9 + lVar8);
      uVar2 = *(uint *)((long)puVar9 + lVar8 + 4);
      uVar12 = *(uint *)((long)pKeys + (ulong)uVar6 * 2 + uVar4) >> (bVar5 & 0x1f) & 0xff;
      uVar13 = *(uint *)((long)pKeys + (ulong)uVar2 * 2 + uVar4) >> (bVar5 & 0x1f) & 0xff;
      uVar3 = auStack_1438[uVar12];
      if (uVar12 == uVar13) {
        auStack_1438[uVar12] = uVar3 + 2;
        pIndices1[uVar3] = uVar6;
        uVar12 = uVar3 + 1;
      }
      else {
        auStack_1438[uVar12] = uVar3 + 1;
        uVar12 = auStack_1438[uVar13];
        auStack_1438[uVar13] = uVar12 + 1;
        pIndices1[uVar3] = uVar6;
      }
      pIndices1[uVar12] = uVar2;
    }
    if ((num_indices & 1) != 0) {
      pIndices1[auStack_1438
                [(ulong)(*(uint *)((long)pKeys + (ulong)*(uint *)((long)puVar9 + lVar8) * 2 + uVar4)
                        >> (bVar5 & 0x1f)) & 0xff]] = *(uint *)((long)puVar9 + lVar8);
    }
    pIndices0 = pIndices1;
    pIndices1 = puVar9;
  }
  return puVar9;
}

Assistant:

T* indirect_radix_sort(uint num_indices, T* pIndices0, T* pIndices1, const Q* pKeys, uint key_ofs, uint key_size, bool init_indices) {
  CRNLIB_ASSERT_OPEN_RANGE(key_ofs, 0, sizeof(T));
  CRNLIB_ASSERT_CLOSED_RANGE(key_size, 1, 4);

  if (init_indices) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;
    uint i;
    for (i = 0; p != q; p += 2, i += 2) {
      p[0] = static_cast<T>(i);
      p[1] = static_cast<T>(i + 1);
    }

    if (num_indices & 1)
      *p = static_cast<T>(i);
  }

  uint hist[256 * 4];

  memset(hist, 0, sizeof(hist[0]) * 256 * key_size);

#define CRNLIB_GET_KEY(p) (*(const uint*)((const uint8*)(pKeys + *(p)) + key_ofs))
#define CRNLIB_GET_KEY_FROM_INDEX(i) (*(const uint*)((const uint8*)(pKeys + (i)) + key_ofs))

  if (key_size == 4) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
      hist[768 + ((key >> 24) & 0xFF)]++;
    }
  } else if (key_size == 3) {
    T* p = pIndices0;
    T* q = pIndices0 + num_indices;
    for (; p != q; p++) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
      hist[512 + ((key >> 16) & 0xFF)]++;
    }
  } else if (key_size == 2) {
    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[256 + ((key0 >> 8) & 0xFF)]++;

      hist[key1 & 0xFF]++;
      hist[256 + ((key1 >> 8) & 0xFF)]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
      hist[256 + ((key >> 8) & 0xFF)]++;
    }
  } else {
    CRNLIB_ASSERT(key_size == 1);
    if (key_size != 1)
      return NULL;

    T* p = pIndices0;
    T* q = pIndices0 + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      const uint key0 = CRNLIB_GET_KEY(p);
      const uint key1 = CRNLIB_GET_KEY(p + 1);

      hist[key0 & 0xFF]++;
      hist[key1 & 0xFF]++;
    }

    if (num_indices & 1) {
      const uint key = CRNLIB_GET_KEY(p);

      hist[key & 0xFF]++;
    }
  }

  T* pCur = pIndices0;
  T* pNew = pIndices1;

  for (uint pass = 0; pass < key_size; pass++) {
    const uint* pHist = &hist[pass << 8];

    uint offsets[256];

    uint cur_ofs = 0;
    for (uint i = 0; i < 256; i += 2) {
      offsets[i] = cur_ofs;
      cur_ofs += pHist[i];

      offsets[i + 1] = cur_ofs;
      cur_ofs += pHist[i + 1];
    }

    const uint pass_shift = pass << 3;

    T* p = pCur;
    T* q = pCur + (num_indices >> 1) * 2;

    for (; p != q; p += 2) {
      uint index0 = p[0];
      uint index1 = p[1];

      uint c0 = (CRNLIB_GET_KEY_FROM_INDEX(index0) >> pass_shift) & 0xFF;
      uint c1 = (CRNLIB_GET_KEY_FROM_INDEX(index1) >> pass_shift) & 0xFF;

      if (c0 == c1) {
        uint dst_offset0 = offsets[c0];

        offsets[c0] = dst_offset0 + 2;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset0 + 1] = static_cast<T>(index1);
      } else {
        uint dst_offset0 = offsets[c0]++;
        uint dst_offset1 = offsets[c1]++;

        pNew[dst_offset0] = static_cast<T>(index0);
        pNew[dst_offset1] = static_cast<T>(index1);
      }
    }

    if (num_indices & 1) {
      uint index = *p;
      uint c = (CRNLIB_GET_KEY_FROM_INDEX(index) >> pass_shift) & 0xFF;

      uint dst_offset = offsets[c];
      offsets[c] = dst_offset + 1;

      pNew[dst_offset] = static_cast<T>(index);
    }

    T* t = pCur;
    pCur = pNew;
    pNew = t;
  }

  return pCur;
}